

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_gvec_2i_riscv64
               (TCGContext_conflict11 *tcg_ctx,uint32_t dofs,uint32_t aofs,uint32_t oprsz,
               uint32_t maxsz,int64_t c,GVecGen2i_conflict11 *g)

{
  _Bool _Var1;
  byte bVar2;
  _func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_int64_t_conflict11 *p_Var3;
  _func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_int32_t_conflict11 *p_Var4;
  TCGType TVar5;
  TCGv_i64 pTVar6;
  TCGv_i64 ret;
  int32_t data;
  uint32_t tysz;
  ulong uVar7;
  uint uVar8;
  uintptr_t o;
  _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_int64_t_conflict11 *fni;
  
  if (g->fniv == (_func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_int64_t_conflict11 *)0x0) {
switchD_00aad003_caseD_0:
    if (((oprsz - 8 < 0x20) && ((oprsz & 7) == 0)) &&
       (p_Var3 = g->fni8,
       p_Var3 != (_func_void_TCGContext_ptr_TCGv_i64_TCGv_i64_int64_t_conflict11 *)0x0)) {
      _Var1 = g->load_dest;
      pTVar6 = tcg_temp_new_i64(tcg_ctx);
      ret = tcg_temp_new_i64(tcg_ctx);
      for (uVar8 = 0; uVar8 < oprsz; uVar8 = uVar8 + 8) {
        tcg_gen_ld_i64_riscv64(tcg_ctx,pTVar6,tcg_ctx->cpu_env,(ulong)(uVar8 + aofs));
        if (_Var1 == false) {
          uVar7 = (ulong)(dofs + uVar8);
        }
        else {
          uVar7 = (ulong)(dofs + uVar8);
          tcg_gen_ld_i64_riscv64(tcg_ctx,ret,tcg_ctx->cpu_env,uVar7);
        }
        (*p_Var3)(tcg_ctx,ret,pTVar6,c);
        tcg_gen_st_i64_riscv64(tcg_ctx,ret,tcg_ctx->cpu_env,uVar7);
      }
    }
    else {
      data = (int32_t)c;
      if (((0xf < oprsz - 4) || ((oprsz & 3) != 0)) ||
         (p_Var4 = g->fni4,
         p_Var4 == (_func_void_TCGContext_ptr_TCGv_i32_TCGv_i32_int32_t_conflict11 *)0x0)) {
        if (g->fno != (gen_helper_gvec_2_conflict11 *)0x0) {
          tcg_gen_gvec_2_ool_riscv64(tcg_ctx,dofs,aofs,oprsz,maxsz,data,g->fno);
          return;
        }
        pTVar6 = tcg_const_i64_riscv64(tcg_ctx,c);
        tcg_gen_gvec_2i_ool_riscv64(tcg_ctx,dofs,aofs,pTVar6,oprsz,maxsz,data,g->fnoi);
        tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
        return;
      }
      _Var1 = g->load_dest;
      pTVar6 = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
      ret = (TCGv_i64)tcg_temp_new_i32(tcg_ctx);
      for (uVar8 = 0; uVar8 < oprsz; uVar8 = uVar8 + 4) {
        tcg_gen_ld_i32(tcg_ctx,(TCGv_i32)pTVar6,tcg_ctx->cpu_env,(ulong)(aofs + uVar8));
        if (_Var1 == false) {
          uVar7 = (ulong)(dofs + uVar8);
        }
        else {
          uVar7 = (ulong)(dofs + uVar8);
          tcg_gen_ld_i32(tcg_ctx,(TCGv_i32)ret,tcg_ctx->cpu_env,uVar7);
        }
        (*p_Var4)(tcg_ctx,(TCGv_i32)ret,(TCGv_i32)pTVar6,data);
        tcg_gen_st_i32(tcg_ctx,(TCGv_i32)ret,tcg_ctx->cpu_env,uVar7);
      }
    }
    tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
    tcg_temp_free_internal_riscv64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  }
  else {
    TVar5 = choose_vector_type(tcg_ctx,g->opt_opc,(uint)g->vece,oprsz,g->prefer_i64);
    switch(TVar5) {
    case TCG_TYPE_I32:
      goto switchD_00aad003_caseD_0;
    default:
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/tcg/tcg-op-gvec.c"
                 ,0x47c,(char *)0x0);
    case TCG_TYPE_V64:
      bVar2 = g->vece;
      _Var1 = g->load_dest;
      tysz = 8;
      fni = g->fniv;
      TVar5 = TCG_TYPE_V64;
      break;
    case TCG_TYPE_V256:
      uVar8 = oprsz & 0xffffffe0;
      expand_2i_vec(tcg_ctx,(uint)g->vece,dofs,aofs,uVar8,0x20,TCG_TYPE_V256,c,g->load_dest,g->fniv)
      ;
      if (uVar8 == oprsz) goto LAB_00aad297;
      dofs = dofs + uVar8;
      aofs = aofs + uVar8;
      oprsz = oprsz & 0x1f;
      maxsz = maxsz - uVar8;
    case TCG_TYPE_V128:
      bVar2 = g->vece;
      _Var1 = g->load_dest;
      tysz = 0x10;
      fni = g->fniv;
      TVar5 = TCG_TYPE_V128;
    }
    expand_2i_vec(tcg_ctx,(uint)bVar2,dofs,aofs,oprsz,tysz,TVar5,c,_Var1,fni);
  }
LAB_00aad297:
  if (maxsz < oprsz || maxsz - oprsz == 0) {
    return;
  }
  expand_clr(tcg_ctx,dofs + oprsz,maxsz - oprsz);
  return;
}

Assistant:

void tcg_gen_gvec_2i(TCGContext *tcg_ctx, uint32_t dofs, uint32_t aofs, uint32_t oprsz,
                     uint32_t maxsz, int64_t c, const GVecGen2i *g)
{
    const TCGOpcode *this_list = g->opt_opc ? g->opt_opc : vecop_list_empty;
    const TCGOpcode *hold_list = tcg_swap_vecop_list(this_list);
    TCGType type;
    uint32_t some;

    check_size_align(oprsz, maxsz, dofs | aofs);
    check_overlap_2(dofs, aofs, maxsz);

    type = 0;
    if (g->fniv) {
        type = choose_vector_type(tcg_ctx, g->opt_opc, g->vece, oprsz, g->prefer_i64);
    }
    switch (type) {
    case TCG_TYPE_V256:
        /* Recall that ARM SVE allows vector sizes that are not a
         * power of 2, but always a multiple of 16.  The intent is
         * that e.g. size == 80 would be expanded with 2x32 + 1x16.
         */
        some = QEMU_ALIGN_DOWN(oprsz, 32);
        expand_2i_vec(tcg_ctx, g->vece, dofs, aofs, some, 32, TCG_TYPE_V256,
                      c, g->load_dest, g->fniv);
        if (some == oprsz) {
            break;
        }
        dofs += some;
        aofs += some;
        oprsz -= some;
        maxsz -= some;
        /* fallthru */
    case TCG_TYPE_V128:
        expand_2i_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 16, TCG_TYPE_V128,
                      c, g->load_dest, g->fniv);
        break;
    case TCG_TYPE_V64:
        expand_2i_vec(tcg_ctx, g->vece, dofs, aofs, oprsz, 8, TCG_TYPE_V64,
                      c, g->load_dest, g->fniv);
        break;

    case 0:
        if (g->fni8 && check_size_impl(oprsz, 8)) {
            expand_2i_i64(tcg_ctx, dofs, aofs, oprsz, c, g->load_dest, g->fni8);
        } else if (g->fni4 && check_size_impl(oprsz, 4)) {
            expand_2i_i32(tcg_ctx, dofs, aofs, oprsz, c, g->load_dest, g->fni4);
        } else {
            if (g->fno) {
                tcg_gen_gvec_2_ool(tcg_ctx, dofs, aofs, oprsz, maxsz, c, g->fno);
            } else {
                TCGv_i64 tcg_c = tcg_const_i64(tcg_ctx, c);
                tcg_gen_gvec_2i_ool(tcg_ctx, dofs, aofs, tcg_c, oprsz,
                                    maxsz, c, g->fnoi);
                tcg_temp_free_i64(tcg_ctx, tcg_c);
            }
            oprsz = maxsz;
        }
        break;

    default:
        g_assert_not_reached();
    }
    tcg_swap_vecop_list(hold_list);

    if (oprsz < maxsz) {
        expand_clr(tcg_ctx, dofs + oprsz, maxsz - oprsz);
    }
}